

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

void runOnce<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>>
               (void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  rep rVar9;
  ulong uVar10;
  type diff;
  time_point end_time;
  int64_t cursor;
  int i_4;
  int i_3;
  int i_2;
  time_point start_time;
  thread *tp;
  int i_1;
  thread *tc;
  int i;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  s;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  Sequence *sequences;
  memory_order __b_1;
  memory_order __b;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  *in_stack_fffffffffffffbc8;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  *in_stack_fffffffffffffbd0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffbd8;
  pointer *pppSVar11;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  *in_stack_fffffffffffffbe0;
  size_t in_stack_fffffffffffffbe8;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  *pSVar12;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  *in_stack_fffffffffffffbf0;
  ulong *puVar13;
  reference_wrapper<disruptor::Sequence> *in_stack_fffffffffffffbf8;
  ulong *puVar14;
  reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>_>
  *in_stack_fffffffffffffc00;
  _func_void_Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>_ptr_Sequence_ptr
  *in_stack_fffffffffffffc08;
  thread *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc28;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  *local_310;
  ulong *local_2e0;
  void *local_2b0;
  duration<long,_std::ratio<1L,_1000L>_> local_288;
  string local_280 [32];
  string local_260 [32];
  rep local_240;
  undefined8 local_238;
  int64_t local_230;
  int local_228;
  int local_224;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  *local_220;
  int local_20c;
  undefined8 local_208;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  *local_200;
  Sequence *local_1f8;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  *local_1f0;
  int local_1dc;
  ulong *local_1d8;
  void *local_1d0;
  int local_1c4;
  void *local_40;
  __atomic_base<long> local_38;
  memory_order local_30;
  undefined4 local_2c;
  atomic<long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<long> local_10;
  atomic<long> *local_8;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Staring run ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_8 = &sum;
  local_10._M_i = 0;
  local_14 = 5;
  local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_20 = local_10._M_i;
  if ((local_14 != 3) && (local_14 == 5)) {
    LOCK();
    UNLOCK();
  }
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)(__atomic_base<long>)local_10._M_i;
  uVar5 = (ulong)nc;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x78),0);
  if (SUB168(auVar1 * ZEXT816(0x78),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_40 = operator_new__(uVar6);
  if (uVar5 != 0) {
    local_2b0 = local_40;
    do {
      disruptor::Sequence::Sequence
                ((Sequence *)in_stack_fffffffffffffbd0,(int64_t)in_stack_fffffffffffffbc8);
      local_2b0 = (void *)((long)local_2b0 + 0x78);
    } while (local_2b0 != (void *)((long)local_40 + uVar5 * 0x78));
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x169146);
  disruptor::
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  ::Sequencer(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  for (local_1c4 = 0; local_1c4 < nc; local_1c4 = local_1c4 + 1) {
    local_1d0 = (void *)((long)local_40 + (long)local_1c4 * 0x78);
    std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::push_back
              ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
               in_stack_fffffffffffffbd0,(value_type *)in_stack_fffffffffffffbc8);
  }
  disruptor::
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  ::set_gating_sequences
            (in_stack_fffffffffffffbd0,
             (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             in_stack_fffffffffffffbc8);
  uVar5 = (ulong)nc;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  uVar10 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar10 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  local_1d8 = (ulong *)operator_new__(uVar10);
  *local_1d8 = uVar5;
  local_1d8 = local_1d8 + 1;
  if (uVar5 != 0) {
    local_2e0 = local_1d8;
    do {
      std::thread::thread((thread *)0x1692d9);
      local_2e0 = local_2e0 + 1;
    } while (local_2e0 != local_1d8 + uVar5);
  }
  for (local_1dc = 0; local_1dc < nc; local_1dc = local_1dc + 1) {
    local_1f0 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,0>>
                             (in_stack_fffffffffffffbc8);
    local_1f8 = (Sequence *)std::ref<disruptor::Sequence>((Sequence *)in_stack_fffffffffffffbc8);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,0>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,0>>,std::reference_wrapper<disruptor::Sequence>,void>
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
               in_stack_fffffffffffffbf8);
    std::thread::operator=((thread *)in_stack_fffffffffffffbd0,(thread *)in_stack_fffffffffffffbc8);
    std::thread::~thread((thread *)0x1693b8);
  }
  uVar5 = (ulong)np;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  uVar10 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar10 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar7 = (ulong *)operator_new__(uVar10);
  *puVar7 = uVar5;
  local_200 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
               *)(puVar7 + 1);
  if (uVar5 != 0) {
    local_310 = local_200;
    do {
      std::thread::thread((thread *)0x169473);
      local_310 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
                   *)&(local_310->ring_buffer_).events_;
    } while (local_310 !=
             (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
              *)((local_200->cursor_).padding0_ + (uVar5 - 4)));
  }
  local_208 = std::chrono::_V2::system_clock::now();
  for (local_20c = 0; local_20c < np; local_20c = local_20c + 1) {
    local_220 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,0>>
                             (in_stack_fffffffffffffbc8);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,0>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,0>>,void>
              (in_stack_fffffffffffffc10,
               (_func_void_Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>_ptr
                *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    std::thread::operator=((thread *)in_stack_fffffffffffffbd0,(thread *)in_stack_fffffffffffffbc8);
    std::thread::~thread((thread *)0x16952f);
  }
  for (local_224 = 0; local_224 < np; local_224 = local_224 + 1) {
    std::thread::join();
  }
  for (local_228 = 0; local_228 < nc; local_228 = local_228 + 1) {
    std::thread::join();
  }
  local_230 = disruptor::
              Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
              ::GetCursor((Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
                           *)0x1695e6);
  poVar4 = std::operator<<((ostream *)&std::cout,"\nBatch size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,delta);
  poVar4 = std::operator<<(poVar4," Ring buffer size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,RING_BUFFER_SIZE);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Cursor: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_230);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Sum: ");
  local_28 = &sum;
  local_2c = 5;
  local_30 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_38 = sum.super___atomic_base<long>._M_i;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)sum.super___atomic_base<long>._M_i);
  poVar4 = std::operator<<(poVar4," Expected sum: ");
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,(expectedValue * (expectedValue + 1) * (long)nc) / 2);
  std::operator<<(poVar4,'\n');
  local_238 = std::chrono::_V2::system_clock::now();
  local_240 = (rep)std::chrono::operator-
                             (in_stack_fffffffffffffbd8,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffbd0);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,np);
  poVar4 = std::operator<<(poVar4,"P-");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,nc);
  poVar4 = std::operator<<(poVar4,"C ");
  std::type_info::name((type_info *)&disruptor::MultiThreadedStrategyEx::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffc28);
  poVar4 = std::operator<<(poVar4,local_260);
  poVar4 = std::operator<<(poVar4," ");
  std::type_info::name
            ((type_info *)
             &disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>::
              typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffc28);
  poVar4 = std::operator<<(poVar4,local_280);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_260);
  lVar8 = local_230 * 1000;
  local_288.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffbc8);
  rVar9 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_288);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,lVar8 / rVar9);
  poVar4 = std::operator<<(poVar4," ops/secs");
  std::operator<<(poVar4,"\n\n");
  if (local_1d8 != (ulong *)0x0) {
    puVar14 = local_1d8 + -1;
    puVar13 = local_1d8 + local_1d8[-1];
    puVar7 = local_1d8;
    if (local_1d8 != puVar13) {
      do {
        puVar13 = puVar13 + -1;
        std::thread::~thread((thread *)0x169a8b);
      } while (puVar13 != puVar7);
    }
    operator_delete__(puVar14);
  }
  if (local_200 !=
      (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
       *)0x0) {
    pppSVar11 = &local_200[-1].gating_sequences_.
                 super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    in_stack_fffffffffffffbe0 =
         (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
          *)((local_200->cursor_).padding0_ +
            (long)local_200[-1].gating_sequences_.
                  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + -4);
    pSVar12 = local_200;
    if (local_200 != in_stack_fffffffffffffbe0) {
      do {
        in_stack_fffffffffffffbd0 =
             (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
              *)&in_stack_fffffffffffffbe0[-1].gating_sequences_.
                 super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::thread::~thread((thread *)0x169af8);
        in_stack_fffffffffffffbe0 = in_stack_fffffffffffffbd0;
      } while (in_stack_fffffffffffffbd0 != pSVar12);
    }
    operator_delete__(pppSVar11);
  }
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  disruptor::
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  ::~Sequencer(in_stack_fffffffffffffbd0);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             in_stack_fffffffffffffbe0);
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  //std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}